

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

fnet_socket_t fnet_socket_bind(fnet_sock_t sock_type,fnet_address_t *addr)

{
  ushort uVar1;
  int iVar2;
  sockaddr *in_RSI;
  fnet_sock_t in_EDI;
  int sock;
  fnet_socket_t local_4;
  
  if (in_RSI == (sockaddr *)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    uVar1 = in_RSI->sa_family;
    iVar2 = fnet_sock_type2posix(in_EDI);
    local_4 = socket((uint)uVar1,iVar2,0);
    if (local_4 == 0xffffffff) {
      local_4 = 0xffffffff;
    }
    else {
      iVar2 = bind(local_4,in_RSI,0x80);
      if (iVar2 == -1) {
        close(local_4);
        local_4 = 0xffffffff;
      }
      else if ((in_EDI == FNET_SOCK_STREAM) && (iVar2 = listen(local_4,10), iVar2 == -1)) {
        close(local_4);
        local_4 = 0xffffffff;
      }
    }
  }
  return local_4;
}

Assistant:

fnet_socket_t fnet_socket_bind(fnet_sock_t sock_type, fnet_address_t const *addr)
{
    if (!addr)
    {
        FLOG_ERR("Invalid address");
        return FNET_INVALID_SOCKET;
    }

    int sock = socket(addr->ss_family, fnet_sock_type2posix(sock_type), 0);
    if (sock == -1)
    {
        FLOG_ERR("Unable to create new socket");
        return FNET_INVALID_SOCKET;
    }

    if (bind(sock, (const struct sockaddr*)addr, sizeof *addr) == -1)
    {
        FLOG_ERR("Socket bind error");
        close(sock);
        return FNET_INVALID_SOCKET;
    }

    if (sock_type == FNET_SOCK_STREAM
        && listen(sock, FMAX_ACCEPT_CONNECTIONS) == -1)
    {
        FLOG_ERR("Socket listen error");
        close(sock);
        return FNET_INVALID_SOCKET;
    }

    return (fnet_socket_t)sock;
}